

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O0

Quaternion * AML::unit(Quaternion *__return_storage_ptr__,Quaternion *rhs)

{
  anon_union_32_2_4720223f_for_Quaternion_0 local_38;
  double local_18;
  double mag;
  Quaternion *rhs_local;
  
  mag = (double)rhs;
  local_18 = norm(rhs);
  if (local_18 <= 0.0) {
    (__return_storage_ptr__->field_0).data[0] = *(double *)mag;
    (__return_storage_ptr__->field_0).data[1] = *(double *)((long)mag + 8);
    (__return_storage_ptr__->field_0).data[2] = *(double *)((long)mag + 0x10);
    (__return_storage_ptr__->field_0).data[3] = *(double *)((long)mag + 0x18);
  }
  else {
    local_38.data[0] = (double)*(undefined8 *)mag;
    local_38.data[1] = *(double *)((long)mag + 8);
    local_38.data[2] = *(double *)((long)mag + 0x10);
    local_38.data[3] = *(double *)((long)mag + 0x18);
    operator/(__return_storage_ptr__,(Quaternion *)&local_38.field_1,local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

Quaternion unit(const Quaternion& rhs)
    {
        double mag = norm(rhs);
        if (mag > 0.0)
        {
            return (Quaternion(rhs) / mag);
        }
        return Quaternion(rhs);
    }